

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

char * parse_token(char *buf,char *buf_end,char **token,size_t *token_len,char next_char,int *ret)

{
  int local_4c;
  char *pcStack_48;
  int found;
  char *buf_start;
  int *ret_local;
  size_t *psStack_30;
  char next_char_local;
  size_t *token_len_local;
  char **token_local;
  char *buf_end_local;
  char *buf_local;
  
  pcStack_48 = buf;
  buf_start = (char *)ret;
  ret_local._7_1_ = next_char;
  psStack_30 = token_len;
  token_len_local = (size_t *)token;
  token_local = (char **)buf_end;
  buf_end_local = buf;
  buf_end_local = findchar_fast(buf,buf_end,"",0x10,&local_4c);
  if ((local_4c == 0) && ((char **)buf_end_local == token_local)) {
    buf_start[0] = -2;
    buf_start[1] = -1;
    buf_start[2] = -1;
    buf_start[3] = -1;
  }
  else {
    do {
      if (*buf_end_local == ret_local._7_1_) {
        *token_len_local = (size_t)pcStack_48;
        *psStack_30 = (long)buf_end_local - (long)pcStack_48;
        return buf_end_local;
      }
      if (token_char_map[(byte)*buf_end_local] == '\0') {
        buf_start[0] = -1;
        buf_start[1] = -1;
        buf_start[2] = -1;
        buf_start[3] = -1;
        return (char *)0x0;
      }
      buf_end_local = buf_end_local + 1;
    } while ((char **)buf_end_local != token_local);
    buf_start[0] = -2;
    buf_start[1] = -1;
    buf_start[2] = -1;
    buf_start[3] = -1;
  }
  return (char *)0x0;
}

Assistant:

static const char *parse_token(const char *buf, const char *buf_end, const char **token, size_t *token_len, char next_char,
                               int *ret)
{
    /* We use pcmpestri to detect non-token characters. This instruction can take no more than eight character ranges (8*2*8=128
     * bits that is the size of a SSE register). Due to this restriction, characters `|` and `~` are handled in the slow loop. */
    static const char ALIGNED(16) ranges[] = "\x00 "  /* control chars and up to SP */
                                             "\"\""   /* 0x22 */
                                             "()"     /* 0x28,0x29 */
                                             ",,"     /* 0x2c */
                                             "//"     /* 0x2f */
                                             ":@"     /* 0x3a-0x40 */
                                             "[]"     /* 0x5b-0x5d */
                                             "{\xff"; /* 0x7b-0xff */
    const char *buf_start = buf;
    int found;
    buf = findchar_fast(buf, buf_end, ranges, sizeof(ranges) - 1, &found);
    if (!found) {
        CHECK_EOF();
    }
    while (1) {
        if (*buf == next_char) {
            break;
        } else if (!token_char_map[(unsigned char)*buf]) {
            *ret = -1;
            return NULL;
        }
        ++buf;
        CHECK_EOF();
    }
    *token = buf_start;
    *token_len = buf - buf_start;
    return buf;
}